

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

int IoTHubClientCore_LL_DeviceMethodComplete
              (char *method_name,uchar *payLoad,size_t size,METHOD_HANDLE response_id,void *ctx)

{
  int iVar1;
  long local_58;
  size_t response_size;
  uchar *payload_resp;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  void *pvStack_30;
  int result;
  void *ctx_local;
  METHOD_HANDLE response_id_local;
  size_t size_local;
  uchar *payLoad_local;
  char *method_name_local;
  
  pvStack_30 = ctx;
  ctx_local = response_id;
  response_id_local = (METHOD_HANDLE)size;
  size_local = (size_t)payLoad;
  payLoad_local = (uchar *)method_name;
  if (ctx == (void *)0x0) {
    handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)xlogging_get_log_function();
    if (handleData != (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
      (*(code *)handleData)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"IoTHubClientCore_LL_DeviceMethodComplete",0x350,1,"Invalid argument ctx=%p",
                 pvStack_30);
    }
    l._4_4_ = 0x351;
  }
  else {
    iVar1 = *(int *)((long)ctx + 0x120);
    payload_resp = (uchar *)ctx;
    if (iVar1 == 4) {
      response_size = 0;
      local_58 = 0;
      l._4_4_ = (**(code **)((long)ctx + 0x128))
                          (method_name,payLoad,size,&response_size,&local_58,
                           *(undefined8 *)((long)ctx + 0x140));
      if ((response_size == 0) || (local_58 == 0)) {
        l._4_4_ = 0x364;
      }
      else {
        l._4_4_ = (**(code **)(payload_resp + 0x60))
                            (*(undefined8 *)(payload_resp + 0x40),ctx_local,response_size,local_58,
                             l._4_4_);
      }
      if (response_size != 0) {
        free((void *)response_size);
      }
    }
    else if (iVar1 == 5) {
      l._4_4_ = (**(code **)((long)ctx + 0x130))
                          (method_name,payLoad,size,response_id,*(undefined8 *)((long)ctx + 0x140));
    }
    else if (iVar1 == 6) {
      l._4_4_ = invoke_command_callback
                          ((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)ctx,method_name,payLoad,size,
                           response_id);
    }
    else {
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

static int IoTHubClientCore_LL_DeviceMethodComplete(const char* method_name, const unsigned char* payLoad, size_t size, METHOD_HANDLE response_id, void* ctx)
{
    int result;
    if (ctx == NULL)
    {
        LogError("Invalid argument ctx=%p", ctx);
        result = MU_FAILURE;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;
        switch (handleData->methodCallback.type)
        {
            case CALLBACK_TYPE_METHOD:
            {
                unsigned char* payload_resp = NULL;
                size_t response_size = 0;
                result = handleData->methodCallback.deviceMethodCallback(method_name, payLoad, size, &payload_resp, &response_size, handleData->methodCallback.userContextCallback);

                if (payload_resp != NULL && response_size > 0)
                {
                    result = handleData->IoTHubTransport_DeviceMethod_Response(handleData->deviceHandle, response_id, payload_resp, response_size, result);
                }
                else
                {
                    result = MU_FAILURE;
                }
                if (payload_resp != NULL)
                {
                    free(payload_resp);
                }
                break;
            }
            case CALLBACK_TYPE_COMMAND:
                result = invoke_command_callback(handleData, method_name, payLoad, size, response_id);
                break;
            case CALLBACK_TYPE_INBOUND_METHOD:
                result = handleData->methodCallback.inboundDeviceMethodCallback(method_name, payLoad, size, response_id, handleData->methodCallback.userContextCallback);
                break;
            default:
                result = 0;
                break;
        }
    }
    return result;
}